

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::CalcContactJacobian
               (Model *model,VectorNd *Q,ConstraintSet *CS,MatrixNd *G,bool update_kinematics)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  undefined7 in_register_00000081;
  ulong uVar5;
  Scalar SVar6;
  MatrixNd Gi;
  Vector3d gaxis;
  Vector3d prev_body_point;
  int local_9c;
  MatrixNd local_90;
  Model *local_78;
  double local_70;
  double local_68;
  double local_60;
  double *local_58;
  long local_50;
  Matrix<double,_3,_1,_0,_3,_1> local_48;
  
  if ((int)CONCAT71(in_register_00000081,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_48,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_90);
  local_70 = (double)CONCAT44(local_70._4_4_,3);
  local_78 = model;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_90,(int *)&local_70,&model->dof_count);
  uVar3 = 0;
  local_9c = 0;
  do {
    uVar4 = (ulong)uVar3;
    if (*(ulong *)(CS + 0x70) <= uVar4) {
      free(local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      return;
    }
    if (local_9c == *(int *)(*(long *)(CS + 0x20) + uVar4 * 4)) {
      bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator!=
                        ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_48,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (uVar4 * 0x18 + *(long *)(CS + 0x38)));
      if (bVar1) goto LAB_00113882;
    }
    else {
LAB_00113882:
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_90);
      CalcPointJacobian(local_78,Q,*(uint *)(*(long *)(CS + 0x20) + uVar4 * 4),
                        (Vector3d *)(*(long *)(CS + 0x38) + uVar4 * 0x18),&local_90,false);
      local_9c = *(int *)(*(long *)(CS + 0x20) + uVar4 * 4);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&local_48,(Matrix<double,_3,_1,_0,_3,_1> *)(uVar4 * 0x18 + *(long *)(CS + 0x38)));
    }
    for (uVar5 = 0; uVar5 < model->dof_count; uVar5 = uVar5 + 1) {
      lVar2 = local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows * uVar5;
      local_70 = local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_data[lVar2];
      local_68 = local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_data[lVar2 + 1];
      local_60 = local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_data[lVar2 + 2];
      local_50 = *(long *)(CS + 0x50) + uVar4 * 0x18;
      local_58 = &local_70;
      SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base *)&local_58);
      (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [(G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows *
       uVar5 + uVar4] = SVar6;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI
void CalcContactJacobian(
		Model &model,
		const Math::VectorNd &Q,
		const ConstraintSet &CS,
		Math::MatrixNd &G,
		bool update_kinematics
		) {
	if (update_kinematics)
		UpdateKinematicsCustom (model, &Q, NULL, NULL);

	unsigned int i,j;

	// variables to check whether we need to recompute G
	unsigned int prev_body_id = 0;
	Vector3d prev_body_point = Vector3d::Zero();
	MatrixNd Gi (3, model.dof_count);

	for (i = 0; i < CS.size(); i++) {
		// only compute the matrix Gi if actually needed
		if (prev_body_id != CS.body[i] || prev_body_point != CS.point[i]) {
			Gi.setZero();
			CalcPointJacobian (model, Q, CS.body[i], CS.point[i], Gi, false);
			prev_body_id = CS.body[i];
			prev_body_point = CS.point[i];
		}

		for (j = 0; j < model.dof_count; j++) {
			Vector3d gaxis (Gi(0,j), Gi(1,j), Gi(2,j));
			G(i,j) = gaxis.transpose() * CS.normal[i];
		}
	}
}